

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void asmjit::BaseCompiler_assignGenericName(BaseCompiler *self,VirtReg *vReg)

{
  uint32_t uVar1;
  uint uVar2;
  Error EVar3;
  char *name;
  uint32_t typeId;
  uint32_t *puVar4;
  BaseCompiler *this;
  char buf [64];
  RegInfo RStack_80;
  uint32_t uStack_7c;
  VirtReg *pVStack_78;
  VirtReg *pVStack_70;
  BaseCompiler *pBStack_68;
  
  this = (BaseCompiler *)&stack0xffffffffffffffa8;
  puVar4 = (uint32_t *)0x40;
  uVar2 = snprintf(&stack0xffffffffffffffa8,0x40,"%%%u",(ulong)(vReg->_id - 0x100));
  name = (char *)(ulong)(uVar2 - 1);
  if (uVar2 - 1 < 0x3f) {
    ZoneStringBase::setData
              ((ZoneStringBase *)&vReg->_name,&(self->super_BaseBuilder)._dataZone,0xb,
               &stack0xffffffffffffffa8,(ulong)uVar2);
    return;
  }
  BaseCompiler_assignGenericName();
  puVar4[0] = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  uStack_7c = typeId;
  pVStack_70 = vReg;
  pBStack_68 = self;
  EVar3 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_BaseBuilder).super_BaseEmitter._environment._arch,typeId,
                     &uStack_7c,&RStack_80);
  if (EVar3 == 0) {
    EVar3 = BaseCompiler::newVirtReg(this,&pVStack_78,uStack_7c,RStack_80._signature,name);
    if (EVar3 == 0) {
      uVar1 = pVStack_78->_id;
      *puVar4 = RStack_80._signature;
      puVar4[1] = uVar1;
      puVar4[2] = 0;
      puVar4[3] = 0;
    }
  }
  else {
    BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
  }
  return;
}

Assistant:

static void BaseCompiler_assignGenericName(BaseCompiler* self, VirtReg* vReg) {
  uint32_t index = unsigned(Operand::virtIdToIndex(vReg->_id));

  char buf[64];
  int size = snprintf(buf, ASMJIT_ARRAY_SIZE(buf), "%%%u", unsigned(index));

  ASMJIT_ASSERT(size > 0 && size < int(ASMJIT_ARRAY_SIZE(buf)));
  vReg->_name.setData(&self->_dataZone, buf, unsigned(size));
}